

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::createInvertedSwizzle
          (TGlslangToSpvTraverser *this,Decoration precision,TIntermTyped *node,Id parentResult)

{
  int iVar1;
  Id IVar2;
  undefined4 extraout_var;
  long *plVar3;
  TIntermAggregate *node_00;
  undefined4 extraout_var_00;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> swizzle;
  Id parentResult_local;
  TIntermTyped *node_local;
  Decoration precision_local;
  TGlslangToSpvTraverser *this_local;
  
  swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = parentResult;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x14])();
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x198))();
  node_00 = (TIntermAggregate *)(**(code **)(*plVar3 + 0x30))();
  convertSwizzle(this,node_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  IVar2 = convertGlslangToSpvType(this,(TType *)CONCAT44(extraout_var_00,iVar1),false);
  IVar2 = spv::Builder::createRvalueSwizzle
                    (&this->builder,precision,IVar2,
                     swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return IVar2;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createInvertedSwizzle(spv::Decoration precision, const glslang::TIntermTyped& node,
    spv::Id parentResult)
{
    std::vector<unsigned> swizzle;
    convertSwizzle(*node.getAsBinaryNode()->getRight()->getAsAggregate(), swizzle);
    return builder.createRvalueSwizzle(precision, convertGlslangToSpvType(node.getType()), parentResult, swizzle);
}